

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiPair.h
# Opt level: O2

void __thiscall
MultiMap::
Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::~Pair
          (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
           *this)

{
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->values).super__Vector_base<long,_std::allocator<long>_>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Pair(const Key& key = Key()) : key(key) {}